

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O3

int __thiscall gdsForge::GDSwriteInt(gdsForge *this,int record,int *arrInt,int cnt)

{
  FILE *__s;
  long lVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined8 uStack_70;
  undefined1 local_68 [16];
  int *local_58;
  undefined1 *local_50;
  gdsForge *local_48;
  int local_3c;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined4 local_34;
  uchar OHout [4];
  long lVar12;
  
  local_35 = (undefined1)record;
  uVar3 = record & 0xff;
  uVar9 = 2;
  local_34 = (undefined4)CONCAT71((uint7)(uint3)((uint)record >> 8),1);
  local_58 = arrInt;
  local_48 = this;
  if ((uVar3 != 2 || cnt < 1) && (uVar9 = 4, uVar3 != 3 || cnt < 1)) {
    if (uVar3 != 0 || cnt != 0) {
      uStack_70 = 0x1104e3;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Incorrect parameters for record: 0x",0x23);
      *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      uStack_70 = 0x110504;
      plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,record);
      uStack_70 = 0x11051b;
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      uStack_70 = 0x110526;
      std::ostream::put((char)plVar6);
      uStack_70 = 0x11052e;
      std::ostream::flush();
      *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      return 1;
    }
    local_34 = 0;
    uVar9 = 0;
  }
  iVar4 = uVar9 * cnt + 4;
  local_38 = (undefined1)((uint)iVar4 >> 8);
  local_37 = (undefined1)iVar4;
  local_36 = (undefined1)((uint)record >> 8);
  uStack_70 = 0x11058a;
  fwrite(&local_38,1,4,(FILE *)this->gdsFile);
  lVar1 = -(ulong)(uVar9 + 0xf & 0xfffffff0);
  if (0 < cnt) {
    uVar10 = 1;
    if (1 < uVar9) {
      uVar10 = (ulong)uVar9;
    }
    lVar12 = uVar10 - 1;
    local_68._8_4_ = (int)lVar12;
    local_68._0_8_ = lVar12;
    local_68._12_4_ = (int)((ulong)lVar12 >> 0x20);
    local_3c = uVar9 * 8 + -0x10;
    uVar7 = 0;
    local_68 = local_68 ^ _DAT_00117a40;
    local_50 = local_68;
    do {
      auVar2 = local_68;
      if ((char)local_34 != '\0') {
        iVar4 = local_58[uVar7];
        uVar8 = 0;
        auVar11 = _DAT_00117a30;
        iVar5 = local_3c;
        do {
          auVar13 = auVar11 ^ _DAT_00117a40;
          if ((bool)(~(auVar2._4_4_ < auVar13._4_4_ ||
                      auVar2._0_4_ < auVar13._0_4_ && auVar13._4_4_ == auVar2._4_4_) & 1)) {
            (local_68 + lVar1)[uVar8] = (char)(iVar4 >> ((byte)iVar5 + 8 & 0x1f));
          }
          if (auVar13._12_4_ <= auVar2._12_4_ &&
              (auVar13._8_4_ <= auVar2._8_4_ || auVar13._12_4_ != auVar2._12_4_)) {
            local_68[uVar8 + lVar1 + 1] = (char)(iVar4 >> ((byte)iVar5 & 0x1f));
          }
          uVar8 = uVar8 + 2;
          lVar12 = auVar11._8_8_;
          auVar11._0_8_ = auVar11._0_8_ + 2;
          auVar11._8_8_ = lVar12 + 2;
          iVar5 = iVar5 + -0x10;
        } while (((int)uVar10 + 1U & 0xfffffffe) != uVar8);
      }
      __s = (FILE *)local_48->gdsFile;
      *(undefined8 *)(local_68 + lVar1 + -8) = 0x110691;
      fwrite(local_68 + lVar1,1,(ulong)uVar9,__s);
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)cnt);
  }
  return 0;
}

Assistant:

int gdsForge::GDSwriteInt(int record, int arrInt[], int cnt)
{
  unsigned int dataSize = record & 0xff;

  if (dataSize == 0x02 && cnt > 0) {
    dataSize = 2; // should/could be omitted
  } else if (dataSize == 0x03 && cnt > 0) {
    dataSize = 4;
  } else if (dataSize == 0x00 && cnt == 0) {
    dataSize = 0; // should/could be omitted
  } else {
    cout << "Incorrect parameters for record: 0x" << hex << record << endl;
    cout << dec;
    return 1;
  }

  unsigned int sizeByte = cnt * dataSize + 4;
  unsigned char OHout[4];

  OHout[0] = sizeByte >> 8 & 0xff;
  OHout[1] = sizeByte & 0xff;
  OHout[2] = record >> 8 & 0xff;
  OHout[3] = record & 0xff;
  fwrite(OHout, 1, 4, this->gdsFile);

  unsigned char dataOut[dataSize];

  for (int i = 0; i < cnt; i++) {
    for (unsigned int j = 0; j < dataSize; j++) {
      dataOut[j] = arrInt[i] >> (((dataSize - 1) * 8) - (j * 8)) & 0xff;
    }
    fwrite(dataOut, 1, dataSize, this->gdsFile);
  }

  return 0;
}